

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * CGL::operator*(Matrix3x3 *__return_storage_ptr__,double c,Matrix3x3 *A)

{
  int local_34;
  int i;
  double *cAij;
  double *Aij;
  Matrix3x3 *A_local;
  double c_local;
  Matrix3x3 *cA;
  
  Matrix3x3::Matrix3x3(__return_storage_ptr__);
  for (local_34 = 0; local_34 < 9; local_34 = local_34 + 1) {
    (&__return_storage_ptr__->entries[0].x)[local_34] = c * (&A->entries[0].x)[local_34];
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 operator*( double c, const Matrix3x3& A ) {

    Matrix3x3 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    for (int i = 0; i < 9; ++i)
      cAij[i] = c * Aij[i];

    return cA;
  }